

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

int __thiscall
baryonyx::itm::compute_order::
infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
          (compute_order *this,
          solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
          *solver,bit_array *x)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  pointer ppVar6;
  uint uVar7;
  _Head_base<0UL,_int_*,_false> _Var8;
  pointer ppVar9;
  ulong uVar10;
  ulong uVar11;
  long in_R9;
  undefined1 auVar12 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  undefined1 auVar31 [64];
  _Head_base<0UL,_int_*,_false> local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  bit_array *local_38;
  undefined1 auVar13 [32];
  undefined1 auVar17 [32];
  
  ppVar6 = (this->m_order).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar6) {
    (this->m_order).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppVar6;
  }
  uVar1 = solver->m;
  ppVar9 = ppVar6;
  if ((ulong)uVar1 != 0) {
    uVar10 = 0;
    local_40._M_head_impl = (int *)this;
    local_38 = x;
    do {
      sparse_matrix<int>::row((sparse_matrix<int> *)&local_50,(int)solver + 0x10);
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
      auVar17._8_4_ = 0xffffffc0;
      auVar17._0_8_ = 0xffffffc0ffffffc0;
      auVar17._12_4_ = 0xffffffc0;
      auVar17._16_4_ = 0xffffffc0;
      auVar17._20_4_ = 0xffffffc0;
      auVar17._24_4_ = 0xffffffc0;
      auVar17._28_4_ = 0xffffffc0;
      auVar19 = vpbroadcastq_avx512f(ZEXT816(1));
      iVar23 = 0;
      if (local_48._M_head_impl != local_50._M_head_impl) {
        uVar11 = 0;
        auVar20 = vpbroadcastq_avx512f();
        auVar20 = vpsrlq_avx512f(auVar20,3);
        auVar31 = ZEXT1664((undefined1  [16])0x0);
        _Var8._M_head_impl = local_48._M_head_impl;
        do {
          auVar21 = vpbroadcastq_avx512f();
          uVar11 = uVar11 + 8;
          auVar21 = vporq_avx512f(auVar21,auVar18);
          uVar4 = vpcmpuq_avx512f(auVar21,auVar20,2);
          vpgatherdd_avx512vl(*(undefined4 *)((long)_Var8._M_head_impl + in_R9));
          auVar13 = vpgatherdd_avx512vl(*(undefined4 *)((long)_Var8._M_head_impl + in_R9 + 4));
          bVar2 = (byte)uVar4;
          auVar14._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar13._4_4_;
          auVar14._0_4_ = (uint)(bVar2 & 1) * auVar13._0_4_;
          auVar14._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar13._8_4_;
          auVar14._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar13._12_4_;
          auVar14._16_4_ = (uint)((byte)(uVar4 >> 4) & 1) * auVar13._16_4_;
          auVar14._20_4_ = (uint)((byte)(uVar4 >> 5) & 1) * auVar13._20_4_;
          auVar14._24_4_ = (uint)((byte)(uVar4 >> 6) & 1) * auVar13._24_4_;
          auVar14._28_4_ = (uint)(byte)(uVar4 >> 7) * auVar13._28_4_;
          _Var8._M_head_impl = _Var8._M_head_impl + 0x10;
          auVar13 = vpsrad_avx2(auVar14,0x1f);
          auVar13 = vpsrld_avx2(auVar13,0x1a);
          auVar13 = vpaddd_avx2(auVar14,auVar13);
          vpsrad_avx2(auVar13,6);
          auVar13 = vpand_avx2(auVar17,auVar13);
          auVar21 = vpgatherdq_avx512f(*(undefined4 *)
                                        ((long)(local_38->super_bit_array_impl).m_data._M_t.
                                               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                               .super__Head_base<0UL,_unsigned_long_*,_false>.
                                               _M_head_impl * 9));
          auVar22._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar21._8_8_;
          auVar22._0_8_ = (ulong)(bVar2 & 1) * auVar21._0_8_;
          auVar22._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar21._16_8_;
          auVar22._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar21._24_8_;
          auVar22._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar21._32_8_;
          auVar22._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar21._40_8_;
          auVar22._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar21._48_8_;
          auVar22._56_8_ = (uVar4 >> 7) * auVar21._56_8_;
          auVar13 = vpsubd_avx2(auVar14,auVar13);
          auVar21 = vpmovzxdq_avx512f(auVar13);
          auVar13 = vpgatherdd_avx512vl((solver->A)._M_t.
                                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
                                        .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                        super__Head_base<0UL,_int_*,_false>._M_head_impl
                                        [(long)&local_50]);
          auVar15._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar13._4_4_;
          auVar15._0_4_ = (uint)(bVar2 & 1) * auVar13._0_4_;
          auVar15._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar13._8_4_;
          auVar15._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar13._12_4_;
          auVar15._16_4_ = (uint)((byte)(uVar4 >> 4) & 1) * auVar13._16_4_;
          auVar15._20_4_ = (uint)((byte)(uVar4 >> 5) & 1) * auVar13._20_4_;
          auVar15._24_4_ = (uint)((byte)(uVar4 >> 6) & 1) * auVar13._24_4_;
          auVar15._28_4_ = (uint)(byte)(uVar4 >> 7) * auVar13._28_4_;
          auVar21 = vpsrlvq_avx512f(auVar22,auVar21);
          uVar5 = vptestmq_avx512f(auVar21,auVar19);
          auVar13 = vpaddd_avx512vl(auVar31._0_32_,auVar15);
          bVar3 = (bool)((byte)uVar5 & 1);
          iVar23 = auVar31._0_4_;
          auVar16._0_4_ = (uint)bVar3 * auVar13._0_4_ | (uint)!bVar3 * iVar23;
          bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
          iVar24 = auVar31._4_4_;
          auVar16._4_4_ = (uint)bVar3 * auVar13._4_4_ | (uint)!bVar3 * iVar24;
          bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
          iVar25 = auVar31._8_4_;
          auVar16._8_4_ = (uint)bVar3 * auVar13._8_4_ | (uint)!bVar3 * iVar25;
          bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
          iVar26 = auVar31._12_4_;
          auVar16._12_4_ = (uint)bVar3 * auVar13._12_4_ | (uint)!bVar3 * iVar26;
          bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
          iVar27 = auVar31._16_4_;
          auVar16._16_4_ = (uint)bVar3 * auVar13._16_4_ | (uint)!bVar3 * iVar27;
          bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
          iVar28 = auVar31._20_4_;
          auVar16._20_4_ = (uint)bVar3 * auVar13._20_4_ | (uint)!bVar3 * iVar28;
          bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
          iVar29 = auVar31._24_4_;
          auVar16._24_4_ = (uint)bVar3 * auVar13._24_4_ | (uint)!bVar3 * iVar29;
          bVar3 = SUB81(uVar5 >> 7,0);
          iVar30 = auVar31._28_4_;
          auVar16._28_4_ = (uint)bVar3 * auVar13._28_4_ | (uint)!bVar3 * iVar30;
          auVar31 = ZEXT3264(auVar16);
        } while (((((long)local_50._M_head_impl - (long)local_48._M_head_impl) - 8U >> 3) + 8 &
                 0xfffffffffffffff8) != uVar11);
        auVar17 = vmovdqa32_avx512vl(auVar16);
        auVar12._0_4_ = (uint)(bVar2 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar2 & 1) * iVar23;
        bVar3 = (bool)((byte)(uVar4 >> 1) & 1);
        auVar12._4_4_ = (uint)bVar3 * auVar17._4_4_ | (uint)!bVar3 * iVar24;
        bVar3 = (bool)((byte)(uVar4 >> 2) & 1);
        auVar12._8_4_ = (uint)bVar3 * auVar17._8_4_ | (uint)!bVar3 * iVar25;
        bVar3 = (bool)((byte)(uVar4 >> 3) & 1);
        auVar12._12_4_ = (uint)bVar3 * auVar17._12_4_ | (uint)!bVar3 * iVar26;
        bVar3 = (bool)((byte)(uVar4 >> 4) & 1);
        auVar13._16_4_ = (uint)bVar3 * auVar17._16_4_ | (uint)!bVar3 * iVar27;
        auVar13._0_16_ = auVar12;
        bVar3 = (bool)((byte)(uVar4 >> 5) & 1);
        auVar13._20_4_ = (uint)bVar3 * auVar17._20_4_ | (uint)!bVar3 * iVar28;
        bVar3 = (bool)((byte)(uVar4 >> 6) & 1);
        auVar13._24_4_ = (uint)bVar3 * auVar17._24_4_ | (uint)!bVar3 * iVar29;
        bVar3 = SUB81(uVar4 >> 7,0);
        auVar13._28_4_ = (uint)bVar3 * auVar17._28_4_ | (uint)!bVar3 * iVar30;
        auVar12 = vphaddd_avx(auVar13._16_16_,auVar12);
        auVar12 = vphaddd_avx(auVar12,auVar12);
        auVar12 = vphaddd_avx(auVar12,auVar12);
        iVar23 = auVar12._0_4_;
      }
      iVar24 = (solver->b)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>::bound_factor_*,_false>
               ._M_head_impl[uVar10].value;
      uVar7 = iVar24 - iVar23;
      if (uVar7 == 0 || iVar24 < iVar23) {
        if (iVar24 < iVar23) {
          uVar7 = iVar23 - iVar24;
          goto LAB_002b004e;
        }
      }
      else {
LAB_002b004e:
        local_50._M_head_impl = (int *)((ulong)uVar7 << 0x20 | uVar10);
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_order,
                   (pair<int,_int> *)&local_50);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar1);
    ppVar9 = (((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
              ((long)local_40._M_head_impl + 0x18))->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    ppVar6 = *(pointer *)((long)local_40._M_head_impl + 0x20);
  }
  return (int)((ulong)((long)ppVar6 - (long)ppVar9) >> 3);
}

Assistant:

int infeasibility_local_compute_violated_constraints(Solver& solver,
                                                         const Xtype& x)
    {
        m_order.clear();

        for (int k = 0, e = solver.m; k != e; ++k) {
            sparse_matrix<int>::const_row_iterator it, et;
            std::tie(it, et) = solver.ap.row(k);
            int v = 0;

            for (; it != et; ++it)
                v += solver.factor(it->value) * x[it->column];

            if (solver.bound_min(k) > v)
                m_order.push_back(std::make_pair(k, solver.bound_min(k) - v));
            else if (solver.bound_max(k) < v)
                m_order.push_back(std::make_pair(k, v - solver.bound_max(k)));
        }

        return length(m_order);
    }